

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O2

SpatialForceVector * __thiscall
iDynTree::Position::changePointOf
          (SpatialForceVector *__return_storage_ptr__,Position *this,SpatialForceVector *other)

{
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> resAngular;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> otherLinear;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> thisPos;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> resLinear;
  AngularVector3T *local_90 [2];
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_80;
  Position *local_70 [2];
  SpatialVector<iDynTree::SpatialForceVector> *local_60 [2];
  type local_50;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_38;
  
  local_60[0] = &__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = 0.0;
  __return_storage_ptr__->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_00237ca8
  ;
  local_80.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&other->super_SpatialVector<iDynTree::SpatialForceVector>;
  local_90[0] = &(__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).
                 angularVec3;
  local_70[0] = this;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_60,
             &local_80);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_50,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>> *)
             local_70,(MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)&local_80);
  local_38.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&(other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3;
  local_38.m_lhs = &local_50;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_90,
             &local_38);
  return __return_storage_ptr__;
}

Assistant:

SpatialForceVector Position::changePointOf(const SpatialForceVector & other) const
    {
        SpatialForceVector result;

        Eigen::Map<const Eigen::Vector3d> thisPos(this->data());
        Eigen::Map<const Eigen::Vector3d> otherLinear(other.getLinearVec3().data());
        Eigen::Map<const Eigen::Vector3d> otherAngular(other.getAngularVec3().data());
        Eigen::Map<Eigen::Vector3d> resLinear(result.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> resAngular(result.getAngularVec3().data());

        resLinear  = otherLinear;
        resAngular = thisPos.cross(otherLinear) + otherAngular;

        return result;
    }